

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetOwnAccessors
               (Var instance,PropertyId propertyId,Var *getter,Var *setter,
               ScriptContext *requestContext)

{
  bool bVar1;
  int iVar2;
  RecyclableObject *pRVar3;
  bool local_41;
  RecyclableObject *object;
  BOOL result;
  ScriptContext *requestContext_local;
  Var *setter_local;
  Var *getter_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    object._4_4_ = 0;
  }
  else {
    pRVar3 = UnsafeVarTo<Js::RecyclableObject>(instance);
    local_41 = false;
    if (pRVar3 != (RecyclableObject *)0x0) {
      iVar2 = (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x15])
                        (pRVar3,(ulong)(uint)propertyId,getter,setter,requestContext);
      local_41 = iVar2 != 0;
    }
    object._4_4_ = (uint)local_41;
  }
  return object._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetOwnAccessors(Var instance, PropertyId propertyId, Var* getter, Var* setter, ScriptContext * requestContext)
    {
        BOOL result;
        if (TaggedNumber::Is(instance))
        {
            result = false;
        }
        else
        {
            RecyclableObject* object = UnsafeVarTo<RecyclableObject>(instance);
            result = object && object->GetAccessors(propertyId, getter, setter, requestContext);
        }
        return result;
    }